

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_bits_per_mb(AV1_COMP *cpi,int use_cyclic_refresh,double correction_factor,int q)

{
  int in_ESI;
  int in_stack_0000000c;
  AV1_COMMON *cm;
  int in_stack_00000018;
  undefined4 local_2c;
  
  if (in_ESI == 0) {
    local_2c = av1_rc_bits_per_mb((AV1_COMP *)correction_factor,q._3_1_,in_stack_00000018,(double)cm
                                  ,in_stack_0000000c);
  }
  else {
    local_2c = av1_cyclic_refresh_rc_bits_per_mb((AV1_COMP *)correction_factor,q,(double)cm);
  }
  return local_2c;
}

Assistant:

static int get_bits_per_mb(const AV1_COMP *cpi, int use_cyclic_refresh,
                           double correction_factor, int q) {
  const AV1_COMMON *const cm = &cpi->common;
  return use_cyclic_refresh
             ? av1_cyclic_refresh_rc_bits_per_mb(cpi, q, correction_factor)
             : av1_rc_bits_per_mb(cpi, cm->current_frame.frame_type, q,
                                  correction_factor,
                                  cpi->sf.hl_sf.accurate_bit_estimate);
}